

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

void __thiscall Graph::~Graph(Graph *this)

{
  long lVar1;
  void *pvVar2;
  ostream *this_00;
  long lVar3;
  undefined8 *in_RDI;
  int i;
  int local_c;
  
  *in_RDI = &PTR__Graph_0011cd78;
  this_00 = std::operator<<((ostream *)&std::cout,"destructor!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  in_RDI[3] = 0;
  lVar1 = in_RDI[2];
  if (lVar1 != 0) {
    for (lVar3 = lVar1 + *(long *)(lVar1 + -8) * 0x30; lVar1 != lVar3; lVar3 = lVar3 + -0x30) {
      Car::~Car((Car *)0x1149c1);
    }
    operator_delete__((void *)(lVar1 + -8));
  }
  in_RDI[2] = 0;
  for (local_c = 0; local_c < *(int *)((long)in_RDI + 0xc); local_c = local_c + 1) {
    pvVar2 = *(void **)(in_RDI[4] + (long)local_c * 8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    *(undefined8 *)(in_RDI[4] + (long)local_c * 8) = 0;
  }
  if ((void *)in_RDI[4] != (void *)0x0) {
    operator_delete__((void *)in_RDI[4]);
  }
  in_RDI[4] = 0;
  return;
}

Assistant:

Graph::~Graph()
{ 
	std::cout << "destructor!" << std::endl;
	delete[] nodes;
	nodes = nullptr;
	delete[] cars;
	cars = nullptr;
	for(int i = 0; i < num_node; i++){
		delete[] distance_matrix[i];
		distance_matrix[i] = nullptr;
	}
	delete[] distance_matrix;
	distance_matrix = nullptr;
}